

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant_impl.hpp
# Opt level: O0

variant_storage<type_safe::optional_variant_policy,_int,_double,_debugger_type> * __thiscall
type_safe::detail::variant_storage<type_safe::optional_variant_policy,_int,_double,_debugger_type>::
operator=(variant_storage<type_safe::optional_variant_policy,_int,_double,_debugger_type> *this,
         variant_storage<type_safe::optional_variant_policy,_int,_double,_debugger_type> *other)

{
  bool bVar1;
  variant_storage<type_safe::optional_variant_policy,_int,_double,_debugger_type> *other_local;
  variant_storage<type_safe::optional_variant_policy,_int,_double,_debugger_type> *this_local;
  
  bVar1 = tagged_union<int,_double,_debugger_type>::has_value(&this->storage_);
  if ((bVar1) &&
     (bVar1 = tagged_union<int,_double,_debugger_type>::has_value(&other->storage_), bVar1)) {
    copy_assign_union_value<type_safe::optional_variant_policy,_type_safe::tagged_union<int,_double,_debugger_type>_>
    ::assign(&this->storage_,&other->storage_);
  }
  else {
    bVar1 = tagged_union<int,_double,_debugger_type>::has_value(&this->storage_);
    if ((!bVar1) ||
       (bVar1 = tagged_union<int,_double,_debugger_type>::has_value(&other->storage_), bVar1)) {
      bVar1 = tagged_union<int,_double,_debugger_type>::has_value(&this->storage_);
      if ((!bVar1) &&
         (bVar1 = tagged_union<int,_double,_debugger_type>::has_value(&other->storage_), bVar1)) {
        copy<int,double,debugger_type>(&this->storage_,&other->storage_);
      }
    }
    else {
      destroy<int,double,debugger_type>(&this->storage_);
    }
  }
  return this;
}

Assistant:

variant_storage& operator=(const variant_storage& other)
        {
            if (storage_.has_value() && other.storage_.has_value())
                copy_assign_union_value<VariantPolicy,
                                        tagged_union<Types...>>::assign(storage_, other.storage_);
            else if (storage_.has_value() && !other.storage_.has_value())
                destroy(storage_);
            else if (!storage_.has_value() && other.storage_.has_value())
                copy(storage_, other.storage_);

            return *this;
        }